

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O0

string * __thiscall
VulkanHppGenerator::generateDeprecatedConstructors
          (string *__return_storage_ptr__,VulkanHppGenerator *this,string *name)

{
  bool bVar1;
  string *name_local;
  VulkanHppGenerator *this_local;
  string *str;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = std::operator==(name,"VkAllocationCallbacks");
  if (bVar1) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (__return_storage_ptr__,
               "\n#if defined( __clang__ ) || defined( __GNUC__ )\n#  pragma GCC diagnostic push\n#  if defined( __clang__ )\n#    pragma clang diagnostic ignored \"-Wunknown-warning-option\"\n#  endif\n#  pragma GCC diagnostic ignored \"-Wcast-function-type\"\n#endif\n    VULKAN_HPP_DEPRECATED( \"This constructor is deprecated. Use the one taking function pointer types from the vk-namespace instead.\" )\n    AllocationCallbacks( void *                               pUserData_,\n                         PFN_vkAllocationFunction             pfnAllocation_,\n                         PFN_vkReallocationFunction           pfnReallocation_       = {},\n                         PFN_vkFreeFunction                   pfnFree_               = {},\n                         PFN_vkInternalAllocationNotification pfnInternalAllocation_ = {},\n                         PFN_vkInternalFreeNotification       pfnInternalFree_       = {} ) VULKAN_HPP_NOEXCEPT\n      : AllocationCallbacks( pUserData_,\n                             reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_AllocationFunction>( pfnAllocation_ ),\n                             reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_ReallocationFunction>( pfnReallocation_ ),\n                             reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_FreeFunction>( pfnFree_ ),\n                             reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_InternalAllocationNotification>( pfnInternalAllocation_ ),\n                             reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_InternalFreeNotification>( pfnInternalFree_ ) )\n    {\n    }\n#if defined( __clang__ ) || defined( __GNUC__ )\n#  pragma GCC diagnostic pop\n#endif\n"
              );
  }
  else {
    bVar1 = std::operator==(name,"VkDebugReportCallbackCreateInfoEXT");
    if (bVar1) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (__return_storage_ptr__,
                 "\n#if defined( __clang__ ) || defined( __GNUC__ )\n#  pragma GCC diagnostic push\n#  if defined( __clang__ )\n#    pragma clang diagnostic ignored \"-Wunknown-warning-option\"\n#  endif\n#  pragma GCC diagnostic ignored \"-Wcast-function-type\"\n#endif\n    VULKAN_HPP_DEPRECATED( \"This constructor is deprecated. Use the one taking function pointer types from the vk-namespace instead.\" )\n    DebugReportCallbackCreateInfoEXT( VULKAN_HPP_NAMESPACE::DebugReportFlagsEXT flags_,\n                                      PFN_vkDebugReportCallbackEXT              pfnCallback_,\n                                      void *                                    pUserData_   = {},\n                                      const void *                              pNext_       = nullptr ) VULKAN_HPP_NOEXCEPT\n      : DebugReportCallbackCreateInfoEXT( flags_, reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_DebugReportCallbackEXT>( pfnCallback_ ), pUserData_, pNext_ )\n    {\n    }\n#if defined( __clang__ ) || defined( __GNUC__ )\n#  pragma GCC diagnostic pop\n#endif\n"
                );
    }
    else {
      bVar1 = std::operator==(name,"VkDebugUtilsMessengerCreateInfoEXT");
      if (bVar1) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (__return_storage_ptr__,
                   "\n#if defined( __clang__ ) || defined( __GNUC__ )\n#  pragma GCC diagnostic push\n#  if defined( __clang__ )\n#    pragma clang diagnostic ignored \"-Wunknown-warning-option\"\n#  endif\n#  pragma GCC diagnostic ignored \"-Wcast-function-type\"\n#endif\n    VULKAN_HPP_DEPRECATED( \"This constructor is deprecated. Use the one taking function pointer types from the vk-namespace instead.\" )\n    DebugUtilsMessengerCreateInfoEXT( VULKAN_HPP_NAMESPACE::DebugUtilsMessengerCreateFlagsEXT flags_,\n                                      VULKAN_HPP_NAMESPACE::DebugUtilsMessageSeverityFlagsEXT messageSeverity_,\n                                      VULKAN_HPP_NAMESPACE::DebugUtilsMessageTypeFlagsEXT     messageType_,\n                                      PFN_vkDebugUtilsMessengerCallbackEXT                    pfnUserCallback_,\n                                      void *                                                  pUserData_       = {},\n                                      const void *                                            pNext_ = nullptr ) VULKAN_HPP_NOEXCEPT\n      : DebugUtilsMessengerCreateInfoEXT( flags_, messageSeverity_, messageType_, reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_DebugUtilsMessengerCallbackEXT>( pfnUserCallback_ ), pUserData_, pNext_ )\n    {\n    }\n#if defined( __clang__ ) || defined( __GNUC__ )\n#  pragma GCC diagnostic pop\n#endif\n"
                  );
      }
      else {
        bVar1 = std::operator==(name,"VkDeviceDeviceMemoryReportCreateInfoEXT");
        if (bVar1) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (__return_storage_ptr__,
                     "\n#if defined( __clang__ ) || defined( __GNUC__ )\n#  pragma GCC diagnostic push\n#  if defined( __clang__ )\n#    pragma clang diagnostic ignored \"-Wunknown-warning-option\"\n#  endif\n#  pragma GCC diagnostic ignored \"-Wcast-function-type\"\n#endif\n    VULKAN_HPP_DEPRECATED( \"This constructor is deprecated. Use the one taking function pointer types from the vk-namespace instead.\" )\n    DeviceDeviceMemoryReportCreateInfoEXT( VULKAN_HPP_NAMESPACE::DeviceMemoryReportFlagsEXT flags_,\n                                           PFN_vkDeviceMemoryReportCallbackEXT              pfnUserCallback_,\n                                           void *                                           pUserData_       = {},\n                                           const void *                                     pNext_ = nullptr ) VULKAN_HPP_NOEXCEPT\n      : DeviceDeviceMemoryReportCreateInfoEXT( flags_, reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_DeviceMemoryReportCallbackEXT>( pfnUserCallback_ ), pUserData_, pNext_ )\n    {\n    }\n#if defined( __clang__ ) || defined( __GNUC__ )\n#  pragma GCC diagnostic pop\n#endif\n"
                    );
        }
        else {
          bVar1 = std::operator==(name,"DirectDriverLoadingInfoLUNARG");
          if (bVar1) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(__return_storage_ptr__,
                      "\n#if defined( __clang__ ) || defined( __GNUC__ )\n#  pragma GCC diagnostic push\n#  if defined( __clang__ )\n#    pragma clang diagnostic ignored \"-Wunknown-warning-option\"\n#  endif\n#  pragma GCC diagnostic ignored \"-Wcast-function-type\"\n#endif\n    VULKAN_HPP_DEPRECATED( \"This constructor is deprecated. Use the one taking function pointer types from the vk-namespace instead.\" )\n    DirectDriverLoadingInfoLUNARG( VULKAN_HPP_NAMESPACE::DirectDriverLoadingFlagsLUNARG flags_,\n                                   PFN_vkGetInstanceProcAddrLUNARG                      pfnGetInstanceProcAddr_,\n                                   void *                                               pNext_ = nullptr ) VULKAN_HPP_NOEXCEPT\n      : DirectDriverLoadingInfoLUNARG( flags_, reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_GetInstanceProcAddrLUNARG>( pfnGetInstanceProcAddr_ ), pNext_ )\n    {\n    }\n#if defined( __clang__ ) || defined( __GNUC__ )\n#  pragma GCC diagnostic pop\n#endif\n"
                     );
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string VulkanHppGenerator::generateDeprecatedConstructors( std::string const & name ) const
{
  std::string str;
  if ( name == "VkAllocationCallbacks" )
  {
    // To be removed around December 2025
    str = R"(
#if defined( __clang__ ) || defined( __GNUC__ )
#  pragma GCC diagnostic push
#  if defined( __clang__ )
#    pragma clang diagnostic ignored "-Wunknown-warning-option"
#  endif
#  pragma GCC diagnostic ignored "-Wcast-function-type"
#endif
    VULKAN_HPP_DEPRECATED( "This constructor is deprecated. Use the one taking function pointer types from the vk-namespace instead." )
    AllocationCallbacks( void *                               pUserData_,
                         PFN_vkAllocationFunction             pfnAllocation_,
                         PFN_vkReallocationFunction           pfnReallocation_       = {},
                         PFN_vkFreeFunction                   pfnFree_               = {},
                         PFN_vkInternalAllocationNotification pfnInternalAllocation_ = {},
                         PFN_vkInternalFreeNotification       pfnInternalFree_       = {} ) VULKAN_HPP_NOEXCEPT
      : AllocationCallbacks( pUserData_,
                             reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_AllocationFunction>( pfnAllocation_ ),
                             reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_ReallocationFunction>( pfnReallocation_ ),
                             reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_FreeFunction>( pfnFree_ ),
                             reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_InternalAllocationNotification>( pfnInternalAllocation_ ),
                             reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_InternalFreeNotification>( pfnInternalFree_ ) )
    {
    }
#if defined( __clang__ ) || defined( __GNUC__ )
#  pragma GCC diagnostic pop
#endif
)";
  }
  else if ( name == "VkDebugReportCallbackCreateInfoEXT" )
  {
    // To be removed around December 2025
    str = R"(
#if defined( __clang__ ) || defined( __GNUC__ )
#  pragma GCC diagnostic push
#  if defined( __clang__ )
#    pragma clang diagnostic ignored "-Wunknown-warning-option"
#  endif
#  pragma GCC diagnostic ignored "-Wcast-function-type"
#endif
    VULKAN_HPP_DEPRECATED( "This constructor is deprecated. Use the one taking function pointer types from the vk-namespace instead." )
    DebugReportCallbackCreateInfoEXT( VULKAN_HPP_NAMESPACE::DebugReportFlagsEXT flags_,
                                      PFN_vkDebugReportCallbackEXT              pfnCallback_,
                                      void *                                    pUserData_   = {},
                                      const void *                              pNext_       = nullptr ) VULKAN_HPP_NOEXCEPT
      : DebugReportCallbackCreateInfoEXT( flags_, reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_DebugReportCallbackEXT>( pfnCallback_ ), pUserData_, pNext_ )
    {
    }
#if defined( __clang__ ) || defined( __GNUC__ )
#  pragma GCC diagnostic pop
#endif
)";
  }
  else if ( name == "VkDebugUtilsMessengerCreateInfoEXT" )
  {
    // To be removed around December 2025
    str = R"(
#if defined( __clang__ ) || defined( __GNUC__ )
#  pragma GCC diagnostic push
#  if defined( __clang__ )
#    pragma clang diagnostic ignored "-Wunknown-warning-option"
#  endif
#  pragma GCC diagnostic ignored "-Wcast-function-type"
#endif
    VULKAN_HPP_DEPRECATED( "This constructor is deprecated. Use the one taking function pointer types from the vk-namespace instead." )
    DebugUtilsMessengerCreateInfoEXT( VULKAN_HPP_NAMESPACE::DebugUtilsMessengerCreateFlagsEXT flags_,
                                      VULKAN_HPP_NAMESPACE::DebugUtilsMessageSeverityFlagsEXT messageSeverity_,
                                      VULKAN_HPP_NAMESPACE::DebugUtilsMessageTypeFlagsEXT     messageType_,
                                      PFN_vkDebugUtilsMessengerCallbackEXT                    pfnUserCallback_,
                                      void *                                                  pUserData_       = {},
                                      const void *                                            pNext_ = nullptr ) VULKAN_HPP_NOEXCEPT
      : DebugUtilsMessengerCreateInfoEXT( flags_, messageSeverity_, messageType_, reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_DebugUtilsMessengerCallbackEXT>( pfnUserCallback_ ), pUserData_, pNext_ )
    {
    }
#if defined( __clang__ ) || defined( __GNUC__ )
#  pragma GCC diagnostic pop
#endif
)";
  }
  else if ( name == "VkDeviceDeviceMemoryReportCreateInfoEXT" )
  {
    // To be removed around December 2025
    str = R"(
#if defined( __clang__ ) || defined( __GNUC__ )
#  pragma GCC diagnostic push
#  if defined( __clang__ )
#    pragma clang diagnostic ignored "-Wunknown-warning-option"
#  endif
#  pragma GCC diagnostic ignored "-Wcast-function-type"
#endif
    VULKAN_HPP_DEPRECATED( "This constructor is deprecated. Use the one taking function pointer types from the vk-namespace instead." )
    DeviceDeviceMemoryReportCreateInfoEXT( VULKAN_HPP_NAMESPACE::DeviceMemoryReportFlagsEXT flags_,
                                           PFN_vkDeviceMemoryReportCallbackEXT              pfnUserCallback_,
                                           void *                                           pUserData_       = {},
                                           const void *                                     pNext_ = nullptr ) VULKAN_HPP_NOEXCEPT
      : DeviceDeviceMemoryReportCreateInfoEXT( flags_, reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_DeviceMemoryReportCallbackEXT>( pfnUserCallback_ ), pUserData_, pNext_ )
    {
    }
#if defined( __clang__ ) || defined( __GNUC__ )
#  pragma GCC diagnostic pop
#endif
)";
  }
  else if ( name == "DirectDriverLoadingInfoLUNARG" )
  {
    // To be removed around December 2025
    str = R"(
#if defined( __clang__ ) || defined( __GNUC__ )
#  pragma GCC diagnostic push
#  if defined( __clang__ )
#    pragma clang diagnostic ignored "-Wunknown-warning-option"
#  endif
#  pragma GCC diagnostic ignored "-Wcast-function-type"
#endif
    VULKAN_HPP_DEPRECATED( "This constructor is deprecated. Use the one taking function pointer types from the vk-namespace instead." )
    DirectDriverLoadingInfoLUNARG( VULKAN_HPP_NAMESPACE::DirectDriverLoadingFlagsLUNARG flags_,
                                   PFN_vkGetInstanceProcAddrLUNARG                      pfnGetInstanceProcAddr_,
                                   void *                                               pNext_ = nullptr ) VULKAN_HPP_NOEXCEPT
      : DirectDriverLoadingInfoLUNARG( flags_, reinterpret_cast<VULKAN_HPP_NAMESPACE::PFN_GetInstanceProcAddrLUNARG>( pfnGetInstanceProcAddr_ ), pNext_ )
    {
    }
#if defined( __clang__ ) || defined( __GNUC__ )
#  pragma GCC diagnostic pop
#endif
)";
  }
  return str;
}